

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QLoggingRule>::copyAppend
          (QGenericArrayOps<QLoggingRule> *this,QLoggingRule *b,QLoggingRule *e)

{
  QLoggingRule *pQVar1;
  Data *pDVar2;
  PatternFlags PVar3;
  long lVar4;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QLoggingRule>).ptr;
    lVar4 = (this->super_QArrayDataPointer<QLoggingRule>).size;
    do {
      pDVar2 = (b->category).d.d;
      pQVar1[lVar4].category.d.d = pDVar2;
      pQVar1[lVar4].category.d.ptr = (b->category).d.ptr;
      pQVar1[lVar4].category.d.size = (b->category).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>
             + 1);
        UNLOCK();
      }
      pQVar1[lVar4].enabled = b->enabled;
      PVar3.super_QFlagsStorageHelper<QLoggingRule::PatternFlag,_4>.
      super_QFlagsStorage<QLoggingRule::PatternFlag>.i =
           (b->flags).super_QFlagsStorageHelper<QLoggingRule::PatternFlag,_4>;
      pQVar1[lVar4].messageType = b->messageType;
      pQVar1[lVar4].flags =
           (PatternFlags)
           PVar3.super_QFlagsStorageHelper<QLoggingRule::PatternFlag,_4>.
           super_QFlagsStorage<QLoggingRule::PatternFlag>.i;
      b = b + 1;
      lVar4 = (this->super_QArrayDataPointer<QLoggingRule>).size + 1;
      (this->super_QArrayDataPointer<QLoggingRule>).size = lVar4;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }